

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_to_hex.hpp
# Opt level: O2

char * mserialize::detail::write_integer_as_hex<char>(char v,char *end)

{
  char cVar1;
  
  if (v == '\0') {
    cVar1 = '0';
  }
  else {
    if ('\0' < v) {
      for (; v != '\0'; v = v / '\x10') {
        end[-1] = "0123456789ABCDEF"[v % '\x10'];
        end = end + -1;
      }
      return end;
    }
    for (; v != '\0'; v = v / '\x10') {
      end[-1] = "0123456789ABCDEF"[-(long)(v % '\x10')];
      end = end + -1;
    }
    cVar1 = '-';
  }
  end[-1] = cVar1;
  return end + -1;
}

Assistant:

constexpr char* write_integer_as_hex(Integer v, char* end)
{
  const char digits[] = "0123456789ABCDEF";

  if (v == 0)
  {
    *--end = '0';
  }
  else if (v > 0)
  {
    while (v != 0)
    {
      *--end = digits[v % 16];
      v = static_cast<Integer>(v / 16);
    }
  }
  else
  {
    while (v != 0)
    {
      *--end = digits[-(v % 16)];
      v = static_cast<Integer>(v / 16);
    }
    *--end = '-';
  }

  return end;
}